

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O2

void av1_quantize_fp_64x64_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m256i thr;
  __m256i qp [3];
  longlong local_100;
  longlong lStack_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  longlong local_c0;
  longlong lStack_b8;
  longlong lStack_b0;
  longlong lStack_a8;
  longlong local_a0;
  longlong lStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  
  local_100 = 0;
  lStack_f8 = 0;
  lStack_f0 = 0;
  lStack_e8 = 0;
  init_qp(round_ptr,quant_ptr,dequant_ptr,2,(__m256i *)&local_e0,(__m256i *)&local_c0);
  quantize_fp_64x64((__m256i *)&local_e0,(__m256i *)&local_c0,coeff_ptr,iscan_ptr,qcoeff_ptr,
                    dqcoeff_ptr,(__m256i *)&local_100);
  lStack_d8 = lStack_98;
  local_e0 = local_a0;
  local_c0 = local_a0;
  lStack_b8 = lStack_98;
  lStack_b0 = local_a0;
  lStack_a8 = lStack_98;
  local_a0 = local_80;
  lStack_98 = uStack_78;
  uStack_90 = local_80;
  uStack_88 = uStack_78;
  local_80 = uStack_60;
  uStack_78 = uStack_58;
  uStack_70 = uStack_60;
  uStack_68 = uStack_58;
  lStack_d0 = local_e0;
  lStack_c8 = lStack_d8;
  while( true ) {
    dqcoeff_ptr = dqcoeff_ptr + 0x10;
    qcoeff_ptr = qcoeff_ptr + 0x10;
    iscan_ptr = iscan_ptr + 0x10;
    coeff_ptr = coeff_ptr + 0x10;
    if (n_coeffs < 0x11) break;
    n_coeffs = n_coeffs + -0x10;
    quantize_fp_64x64((__m256i *)&local_e0,(__m256i *)&local_c0,coeff_ptr,iscan_ptr,qcoeff_ptr,
                      dqcoeff_ptr,(__m256i *)&local_100);
  }
  auVar1._8_8_ = lStack_f8;
  auVar1._0_8_ = local_100;
  auVar2._8_8_ = lStack_e8;
  auVar2._0_8_ = lStack_f0;
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar3._8_2_ = 0x7fff;
  auVar3._0_8_ = 0x7fff7fff7fff7fff;
  auVar3._10_2_ = 0x7fff;
  auVar3._12_2_ = 0x7fff;
  auVar3._14_2_ = 0x7fff;
  auVar1 = vpsubusw_avx(auVar3,auVar1);
  auVar1 = vphminposuw_avx(auVar1);
  *eob_ptr = auVar1._0_2_ ^ 0x7fff;
  return;
}

Assistant:

void av1_quantize_fp_64x64_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 2;
  const unsigned int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_64x64(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                    &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_64x64(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                      &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}